

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Options::Options
          (Options *this,char variable_delimiter,AnnotationCollector *annotation_collector)

{
  this->variable_delimiter = variable_delimiter;
  this->annotation_collector = annotation_collector;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&this->comment_start,"//");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&this->ignored_comment_start,"//~");
  this->spaces_per_indent = 2;
  (this->enable_codegen_trace).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  return;
}

Assistant:

Options(char variable_delimiter, AnnotationCollector* annotation_collector)
        : variable_delimiter(variable_delimiter),
          annotation_collector(annotation_collector) {}